

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_gtest_tests.cpp
# Opt level: O0

void __thiscall
test::syntax_gtest_tests::iu_SyntaxTest_x_iutest_x_Complex_Test::
~iu_SyntaxTest_x_iutest_x_Complex_Test(iu_SyntaxTest_x_iutest_x_Complex_Test *this)

{
  iu_SyntaxTest_x_iutest_x_Complex_Test *this_local;
  
  ~iu_SyntaxTest_x_iutest_x_Complex_Test(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

TEST(SyntaxTest, Complex)
{
    ::std::complex<float> c(1.0f, 1.0f);
    if( float d = 1.0f )
        ASSERT_COMPLEX_EQ(::std::complex<float>(d, d), c) << c;
    if( float d = 1.0f )
        EXPECT_COMPLEX_EQ(::std::complex<float>(d, d), c) << c;
    if( float d = 1.0f )
        INFORM_COMPLEX_EQ(::std::complex<float>(d, d), c) << c;
    if( float d = 1.0f )
        ASSUME_COMPLEX_EQ(::std::complex<float>(d, d), c) << c;
}